

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O1

long hidden_gold(void)

{
  long lVar1;
  long lVar2;
  obj *obj;
  
  lVar2 = 0;
  for (obj = invent; obj != (obj *)0x0; obj = obj->nobj) {
    if (obj->cobj != (obj *)0x0) {
      lVar1 = contained_gold(obj);
      lVar2 = lVar2 + lVar1;
    }
  }
  return lVar2;
}

Assistant:

long hidden_gold(void)
{
	long value = 0L;
	struct obj *obj;

	for (obj = invent; obj; obj = obj->nobj)
	    if (Has_contents(obj))
		value += contained_gold(obj);
	/* unknown gold stuck inside statues may cause some consternation... */

	return value;
}